

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O3

size_t __thiscall flow::ConstantPool::makeHandler(ConstantPool *this,string *name)

{
  pointer ppVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  long lVar3;
  size_type *psVar4;
  size_t sVar5;
  size_t sVar6;
  
  ppVar1 = (this->handlers_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->handlers_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (lVar3 == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = (lVar3 >> 3) * 0x6db6db6db6db6db7;
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    psVar4 = &(ppVar1->first)._M_string_length;
    sVar6 = 0;
    do {
      if (*psVar4 == __n) {
        if (__n == 0) {
          return sVar6;
        }
        iVar2 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar4 + -1))->_M_dataplus)._M_p,__s2,__n);
        if (iVar2 == 0) {
          return sVar6;
        }
      }
      sVar6 = sVar6 + 1;
      psVar4 = psVar4 + 7;
    } while (sVar5 - sVar6 != 0);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::resize(&this->handlers_,sVar5 + 1);
  std::__cxx11::string::_M_assign
            ((string *)
             ((this->handlers_).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + sVar5));
  return sVar5;
}

Assistant:

size_t ConstantPool::makeHandler(const std::string& name) {
  size_t i = 0;
  size_t e = handlers_.size();

  while (i != e) {
    if (handlers_[i].first == name) {
      return i;
    }

    ++i;
  }

  handlers_.resize(i + 1);
  handlers_[i].first = name;
  return i;
}